

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O3

TBox<double> *
lumeview::BoxFromCoords<double>
          (TBox<double> *__return_storage_ptr__,double *coords,index_t num,index_t stride)

{
  double *pdVar1;
  double dVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  
  TBox<double>::TBox(__return_storage_ptr__,1.79769313486232e+308,-1.79769313486232e+308);
  uVar3 = (ulong)stride;
  if (num != 0) {
    uVar4 = 3;
    if (stride < 3) {
      uVar4 = (ulong)stride;
    }
    lVar5 = 0;
    do {
      if (stride != 0) {
        uVar6 = 0;
        do {
          dVar2 = coords[(uint)((int)lVar5 + (int)uVar6)];
          if (dVar2 < *(double *)((long)&(__return_storage_ptr__->minCorner).field_0 + uVar6 * 8)) {
            *(double *)((long)&(__return_storage_ptr__->minCorner).field_0 + uVar6 * 8) = dVar2;
          }
          pdVar1 = (double *)((long)&(__return_storage_ptr__->maxCorner).field_0 + uVar6 * 8);
          if (*pdVar1 <= dVar2 && dVar2 != *pdVar1) {
            *(double *)((long)&(__return_storage_ptr__->maxCorner).field_0 + uVar6 * 8) = dVar2;
          }
          uVar6 = uVar6 + 1;
        } while (uVar4 != uVar6);
      }
      lVar5 = lVar5 + uVar3;
    } while ((uint)lVar5 < num);
  }
  if (stride < 3) {
    do {
      uVar4 = uVar3 + 1;
      *(undefined8 *)((long)&(__return_storage_ptr__->minCorner).field_0 + uVar3 * 8) = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->maxCorner).field_0 + uVar3 * 8) = 0;
      uVar3 = uVar4;
    } while ((int)uVar4 != 3);
  }
  return __return_storage_ptr__;
}

Assistant:

TBox <real_t> BoxFromCoords (const real_t* coords, index_t num, index_t stride)
{
	const index_t cmps = std::min<index_t> (stride, 3);

	TBox <real_t> b (numeric_limits<real_t>::max(), numeric_limits<real_t>::lowest());
	for(index_t i = 0; i < num; i+=stride){
		for(index_t j = 0; j < cmps; ++j){
			if (coords [i+j] < b.minCorner[j])
				b.minCorner[j] = coords [i+j];
			if (coords [i+j] > b.maxCorner[j])
				b.maxCorner[j] = coords [i+j];
		}
	}

	for(index_t i = stride; i < 3; ++i){
		b.minCorner[i] = 0;
		b.maxCorner[i] = 0;
	}

	return b;
}